

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int smlEscapeQuotedString(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  
  iVar3 = (int)out;
  iVar2 = (int)in;
  if (0 < *outlen && 0 < (long)*inlen) {
    pxVar5 = out + *outlen;
    pxVar4 = in + *inlen;
    do {
      xVar1 = *in;
      if ((xVar1 == '\\') || (xVar1 == '\"')) {
        if (pxVar5 <= out + 1) {
          return -1;
        }
        *out = '\\';
        out = out + 1;
      }
      if (xVar1 == '>') {
        builtin_memcpy(out,"&gt;",4);
LAB_001aff2d:
        out = out + 4;
      }
      else {
        if (xVar1 == '<') {
          builtin_memcpy(out,"&lt;",4);
          goto LAB_001aff2d;
        }
        if (xVar1 == '&') {
          builtin_memcpy(out,"&amp;",5);
          out = out + 5;
        }
        else {
          *out = xVar1;
          out = out + 1;
        }
      }
      in = in + 1;
    } while ((in < pxVar4) && (out < pxVar5));
  }
  *outlen = (int)out - iVar3;
  *inlen = (int)in - iVar2;
  return 0;
}

Assistant:

static int
smlEscapeQuotedString(unsigned char* out, int *outlen,
		      const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend = in + *inlen;

    /* Escape the \ and " characters */
    while ((in < inend) && (out < outend)) {
    	char c = *in++;
    	if (c == '\\' || c == '"') {
    	    if ((out+1) >= outend) return -1;
	    *out++ = '\\';
    	}
	/* TODO FOR SML: Convert characters not in the output encoding to &#NNN entities */
	switch(c) {
	case '&':
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    break;
	case '<':
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	case '>':
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	default:
	    *out++ = c;
	    break;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
}